

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O2

void __thiscall
HdlcAnalyzerResults::GenFcsFieldString
          (HdlcAnalyzerResults *this,Frame *frame,DisplayBase display_base,bool tabular)

{
  ulong uVar1;
  ostream *poVar2;
  char *pcVar3;
  uint uVar4;
  stringstream fieldNameStr;
  char calcFcsStr [128];
  char readFcsStr [128];
  char *local_2e0 [4];
  stringstream local_2c0 [16];
  ostream local_2b0 [376];
  char local_138 [128];
  char local_b8 [136];
  
  uVar1 = (ulong)this->mSettings->mHdlcFcs;
  if (uVar1 < 3) {
    uVar4 = *(uint *)(&DAT_00110168 + uVar1 * 4);
    pcVar3 = &DAT_0011015c + *(int *)(&DAT_0011015c + uVar1 * 4);
  }
  else {
    uVar4 = 0;
    pcVar3 = (char *)0x0;
  }
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x10),display_base,uVar4,local_b8,0x80);
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x18),display_base,uVar4,local_138,0x80);
  std::__cxx11::stringstream::stringstream(local_2c0);
  if ((char)frame[0x21] < '\0') {
    std::operator<<(local_2b0,"!");
  }
  poVar2 = std::operator<<(local_2b0,"FCS CRC");
  std::operator<<(poVar2,pcVar3);
  if (!tabular) {
    AnalyzerResults::AddResultString
              ((char *)this,"CRC",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_2e0[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string((string *)local_2e0);
  }
  pcVar3 = " ERROR";
  if (-1 < (char)frame[0x21]) {
    pcVar3 = " OK";
  }
  std::operator<<(local_2b0,pcVar3);
  if (!tabular) {
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_2e0[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string((string *)local_2e0);
  }
  if ((char)frame[0x21] < '\0') {
    poVar2 = std::operator<<(local_2b0," - CALC CRC[");
    poVar2 = std::operator<<(poVar2,local_138);
    poVar2 = std::operator<<(poVar2,"] != READ CRC[");
    poVar2 = std::operator<<(poVar2,local_b8);
    std::operator<<(poVar2,"]");
  }
  if (tabular) {
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddTabularText
              ((char *)this,local_2e0[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_2e0[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  std::__cxx11::string::~string((string *)local_2e0);
  std::__cxx11::stringstream::~stringstream(local_2c0);
  return;
}

Assistant:

void HdlcAnalyzerResults::GenFcsFieldString( const Frame& frame, DisplayBase display_base, bool tabular )
{
    U32 fcsBits = 0;
    char* crcTypeStr = 0;
    switch( mSettings->mHdlcFcs )
    {
    case HDLC_CRC8:
        fcsBits = 8;
        crcTypeStr = "8 ";
        break;
    case HDLC_CRC16:
        fcsBits = 16;
        crcTypeStr = "16";
        break;
    case HDLC_CRC32:
        fcsBits = 32;
        crcTypeStr = "32";
        break;
    }

    char readFcsStr[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, fcsBits, readFcsStr, 128 );
    char calcFcsStr[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData2, display_base, fcsBits, calcFcsStr, 128 );

    stringstream fieldNameStr;
    if( frame.mFlags & DISPLAY_AS_ERROR_FLAG )
    {
        fieldNameStr << "!";
    }

    fieldNameStr << "FCS CRC" << crcTypeStr;

    if( !tabular )
    {
        AddResultString( "CRC" );
        AddResultString( fieldNameStr.str().c_str() );
    }

    if( frame.mFlags & DISPLAY_AS_ERROR_FLAG )
    {
        fieldNameStr << " ERROR";
    }
    else
    {
        fieldNameStr << " OK";
    }

    if( !tabular )
    {
        AddResultString( fieldNameStr.str().c_str() );
    }

    if( frame.mFlags & DISPLAY_AS_ERROR_FLAG )
    {
        fieldNameStr << " - CALC CRC[" << calcFcsStr << "] != READ CRC[" << readFcsStr << "]";
    }

    if( !tabular )
        AddResultString( fieldNameStr.str().c_str() );
    else
        AddTabularText( fieldNameStr.str().c_str() );
}